

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

bool __thiscall jpge::jpeg_encoder::process_end_of_image(jpeg_encoder *this)

{
  uint local_1c;
  int i;
  jpeg_encoder *this_local;
  
  if (this->m_mcu_y_ofs != '\0') {
    if (this->m_mcu_y_ofs < 0x10) {
      for (local_1c = (uint)this->m_mcu_y_ofs; (int)local_1c < this->m_mcu_y;
          local_1c = local_1c + 1) {
        memcpy(this->m_mcu_lines[(int)local_1c],this->m_mcu_lines[(int)(this->m_mcu_y_ofs - 1)],
               (long)this->m_image_bpl_mcu);
      }
    }
    process_mcu_row(this);
  }
  if (this->m_pass_num == '\x01') {
    this_local._7_1_ = terminate_pass_one(this);
  }
  else {
    this_local._7_1_ = terminate_pass_two(this);
  }
  return this_local._7_1_;
}

Assistant:

bool jpeg_encoder::process_end_of_image()
{
  if (m_mcu_y_ofs)
  {
    if (m_mcu_y_ofs < 16) // check here just to shut up static analysis
    {
      for (int i = m_mcu_y_ofs; i < m_mcu_y; i++)
        memcpy(m_mcu_lines[i], m_mcu_lines[m_mcu_y_ofs - 1], m_image_bpl_mcu);
    }

    process_mcu_row();
  }

  if (m_pass_num == 1)
    return terminate_pass_one();
  else
    return terminate_pass_two();
}